

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_jump_stmt(gvisitor_t *self,gnode_jump_stmt_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  ircode_t *code;
  uint32_t p1;
  opcode_t op;
  uint32_t lineno;
  
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  code = (ircode_t *)plVar2[0x14];
  gVar1 = (node->base).token.type;
  if (gVar1 == TOK_KEY_BREAK) {
    p1 = ircode_getlabel_false(code);
  }
  else {
    if (gVar1 != TOK_KEY_CONTINUE) {
      if (gVar1 != TOK_KEY_RETURN) {
        __assert_fail("(type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                      ,800,"void visit_jump_stmt(gvisitor_t *, gnode_jump_stmt_t *)");
      }
      if (node->expr == (gnode_t *)0x0) {
        if (node == (gnode_jump_stmt_t *)0x0) {
          lineno = 0;
        }
        else {
          lineno = (node->base).token.lineno;
        }
        op = RET0;
        p1 = 0;
      }
      else {
        gvisit(self,node->expr);
        p1 = ircode_register_pop(code);
        if (p1 == 0xffffffff) {
          report_error(self,&node->base,"Invalid return expression.");
        }
        if (node == (gnode_jump_stmt_t *)0x0) {
          lineno = 0;
        }
        else {
          lineno = (node->base).token.lineno;
        }
        op = RET;
      }
      goto LAB_00139dd8;
    }
    p1 = ircode_getlabel_check(code);
  }
  if (node == (gnode_jump_stmt_t *)0x0) {
    lineno = 0;
  }
  else {
    lineno = (node->base).token.lineno;
  }
  op = JUMP;
LAB_00139dd8:
  ircode_add(code,op,p1,0,0,lineno);
  return;
}

Assistant:

static void visit_jump_stmt (gvisitor_t *self, gnode_jump_stmt_t *node) {
    DEBUG_CODEGEN("visit_jump_stmt");
    DECLARE_CODE();

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN));

    if (type == TOK_KEY_BREAK) {
        uint32_t label = ircode_getlabel_false(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $end;
    } else if (type == TOK_KEY_CONTINUE) {
        uint32_t label = ircode_getlabel_check(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $start;
    } else if (type == TOK_KEY_RETURN) {
        if (node->expr) {
            visit(node->expr);
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid return expression.");
			ircode_add(code, RET, reg, 0, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, RET0, 0, 0, 0, LINE_NUMBER(node));
        }
    }
}